

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * String::toHex(String *__return_storage_ptr__,void *pAddressIn,size_t lSize)

{
  int iVar1;
  uchar *pAddress;
  byte *pbStack_b8;
  uchar ucTmp;
  uchar *pTmp;
  anon_struct_16_2_b393d77c buf;
  int lRelPos;
  int lOutLen2;
  int lIndex2;
  int lIndex;
  int lOutLen;
  int lIndent;
  char szBuf [100];
  size_t lSize_local;
  void *pAddressIn_local;
  String *ret;
  
  szBuf[0x5f] = '\0';
  unique0x10000169 = lSize;
  String(__return_storage_ptr__,(char *)0x0,0xffffffffffffffff);
  pTmp = (uchar *)pAddressIn;
  for (buf.pData._0_4_ = (int)stack0xffffffffffffffe0; (int)buf.pData != 0;
      buf.pData._0_4_ = (int)buf.pData - lIndex2) {
    pbStack_b8 = pTmp;
    lIndex2 = (int)buf.pData;
    if (0x10 < (int)buf.pData) {
      lIndex2 = 0x10;
    }
    snprintf((char *)&lOutLen,100," >                                                      %08lX",
             (long)pTmp - (long)pAddressIn);
    lOutLen2 = 2;
    lRelPos = 0x27;
    buf.lSize = 0;
    for (buf._12_4_ = lIndex2; buf._12_4_ != 0; buf._12_4_ = buf._12_4_ + -1) {
      pAddress._7_1_ = *pbStack_b8;
      sprintf((char *)((long)&lOutLen + (long)lOutLen2),"%02X ",(ulong)pAddress._7_1_);
      iVar1 = isprint((uint)pAddress._7_1_);
      if (iVar1 == 0) {
        pAddress._7_1_ = 0x2e;
      }
      *(byte *)((long)&lOutLen + (long)lRelPos) = pAddress._7_1_;
      buf.lSize = buf.lSize + 1;
      if ((buf.lSize & 3) == 0) {
        *(undefined1 *)((long)&lOutLen + (long)(lOutLen2 + 3)) = 0x20;
        lOutLen2 = lOutLen2 + 1;
      }
      lOutLen2 = lOutLen2 + 2;
      lRelPos = lRelPos + 1;
      pbStack_b8 = pbStack_b8 + 1;
    }
    if ((buf.lSize & 3) == 0) {
      lOutLen2 = lOutLen2 + -1;
    }
    *(undefined1 *)((long)&lOutLen + (long)lOutLen2) = 0x3c;
    *(char *)((long)lOutLen2 + 1 + (long)&lOutLen) = ' ';
    append(__return_storage_ptr__,(char *)&lOutLen,0xffffffffffffffff);
    pTmp = pTmp + lIndex2;
  }
  return __return_storage_ptr__;
}

Assistant:

String String::toHex(const void *pAddressIn, size_t lSize)
{
    String ret;
    char szBuf[100];
    int lIndent = 1;
    int lOutLen, lIndex, lIndex2, lOutLen2;
    int lRelPos;
    struct {
        const unsigned char *pData;
        unsigned int lSize;
    } buf;
    const unsigned char *pTmp;
    unsigned char ucTmp;
    const unsigned char *pAddress = static_cast<const unsigned char *>(pAddressIn);

    buf.pData = pAddress;
    buf.lSize = lSize;

    while (buf.lSize > 0) {
        pTmp = buf.pData;
        lOutLen = (int)buf.lSize;
        if (lOutLen > 16)
            lOutLen = 16;

        // create a 64-character formatted output line:
        snprintf(szBuf,
                 sizeof(szBuf),
                 " >                            "
                 "                      "
                 "    %08lX",
                 static_cast<long unsigned int>(pTmp - pAddress));
        lOutLen2 = lOutLen;

        for (lIndex = 1 + lIndent, lIndex2 = 53 - 15 + lIndent, lRelPos = 0; lOutLen2; lOutLen2--, lIndex += 2, lIndex2++) {
            ucTmp = *pTmp++;

            sprintf(szBuf + lIndex, "%02X ", (unsigned short)ucTmp);
            if (!isprint(ucTmp))
                ucTmp = '.'; // nonprintable char
            szBuf[lIndex2] = ucTmp;

            if (!(++lRelPos & 3)) // extra blank after 4 bytes
            {
                lIndex++;
                szBuf[lIndex + 2] = ' ';
            }
        }

        if (!(lRelPos & 3))
            lIndex--;

        szBuf[lIndex] = '<';
        szBuf[lIndex + 1] = ' ';

        ret.append(szBuf);

        buf.pData += lOutLen;
        buf.lSize -= lOutLen;
    }
    return ret;
}